

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darScript.c
# Opt level: O0

Aig_Man_t * Dar_ManChoiceNewAig(Aig_Man_t *pAig,Dch_Pars_t *pPars)

{
  int iVar1;
  abctime aVar2;
  Vec_Ptr_t *pVVar3;
  abctime aVar4;
  void *pvVar5;
  void *Entry;
  Aig_Man_t *pAVar6;
  Aig_Man_t *pAVar7;
  char *pcVar8;
  char *pcVar9;
  abctime clk;
  int i;
  char *pSpec;
  char *pName;
  void *pManTime;
  Vec_Ptr_t *vPios;
  Vec_Ptr_t *vAigs;
  Aig_Man_t *pTemp;
  Aig_Man_t *pMan;
  int fVerbose;
  Dch_Pars_t *pPars_local;
  Aig_Man_t *pAig_local;
  
  iVar1 = pPars->fVerbose;
  aVar2 = Abc_Clock();
  pVVar3 = Dar_ManChoiceSynthesis(pAig,1,1,pPars->fPower,iVar1);
  aVar4 = Abc_Clock();
  pPars->timeSynth = aVar4 - aVar2;
  pvVar5 = Vec_PtrPop(pVVar3);
  Entry = Vec_PtrEntry(pVVar3,0);
  Vec_PtrPush(pVVar3,Entry);
  Vec_PtrWriteEntry(pVVar3,0,pvVar5);
  pAVar6 = Dch_DeriveTotalAig(pVVar3);
  for (clk._4_4_ = 0; iVar1 = Vec_PtrSize(pVVar3), clk._4_4_ < iVar1; clk._4_4_ = clk._4_4_ + 1) {
    pAVar7 = (Aig_Man_t *)Vec_PtrEntry(pVVar3,clk._4_4_);
    Aig_ManStop(pAVar7);
  }
  Vec_PtrFree(pVVar3);
  pAVar7 = Dch_ComputeChoices(pAVar6,pPars);
  Aig_ManStop(pAVar6);
  pvVar5 = pAig->pManTime;
  pAig->pManTime = (void *)0x0;
  pcVar8 = Abc_UtilStrsav(pAig->pName);
  pcVar9 = Abc_UtilStrsav(pAig->pSpec);
  pVVar3 = Aig_ManOrderPios(pAVar7,pAig);
  Aig_ManStop(pAig);
  pAVar6 = Aig_ManDupDfsGuided(pAVar7,pVVar3);
  Aig_ManStop(pAVar7);
  Vec_PtrFree(pVVar3);
  pAVar6->pManTime = pvVar5;
  Aig_ManChoiceLevel(pAVar6);
  if (pAVar6->pName != (char *)0x0) {
    free(pAVar6->pName);
    pAVar6->pName = (char *)0x0;
  }
  if (pAVar6->pSpec != (char *)0x0) {
    free(pAVar6->pSpec);
    pAVar6->pSpec = (char *)0x0;
  }
  pAVar6->pName = pcVar8;
  pAVar6->pSpec = pcVar9;
  return pAVar6;
}

Assistant:

Aig_Man_t * Dar_ManChoiceNewAig( Aig_Man_t * pAig, Dch_Pars_t * pPars )
{
//    extern Aig_Man_t * Dch_DeriveTotalAig( Vec_Ptr_t * vAigs );
    extern Aig_Man_t * Dch_ComputeChoices( Aig_Man_t * pAig, Dch_Pars_t * pPars );
    int fVerbose = pPars->fVerbose;
    Aig_Man_t * pMan, * pTemp;
    Vec_Ptr_t * vAigs;
    Vec_Ptr_t * vPios;
    void * pManTime;
    char * pName, * pSpec;
    int i;
    abctime clk;

clk = Abc_Clock();
    vAigs = Dar_ManChoiceSynthesis( pAig, 1, 1, pPars->fPower, fVerbose );
pPars->timeSynth = Abc_Clock() - clk;
    // swap the first and last network
    // this should lead to the primary choice being "better" because of synthesis
    // (it is also important when constructing choices)
    pMan = (Aig_Man_t *)Vec_PtrPop( vAigs );
    Vec_PtrPush( vAigs, Vec_PtrEntry(vAigs,0) );
    Vec_PtrWriteEntry( vAigs, 0, pMan );

    // derive the total AIG
    pMan = Dch_DeriveTotalAig( vAigs );
    // cleanup
    Vec_PtrForEachEntry( Aig_Man_t *, vAigs, pTemp, i )
        Aig_ManStop( pTemp );
    Vec_PtrFree( vAigs );

    // compute choices
    pMan = Dch_ComputeChoices( pTemp = pMan, pPars );
    Aig_ManStop( pTemp );

    // save useful things
    pManTime = pAig->pManTime; pAig->pManTime = NULL;
    pName = Abc_UtilStrsav( pAig->pName );
    pSpec = Abc_UtilStrsav( pAig->pSpec );

    // create guidence
    vPios = Aig_ManOrderPios( pMan, pAig ); 
    Aig_ManStop( pAig );

    // reconstruct the network
    pMan = Aig_ManDupDfsGuided( pTemp = pMan, vPios );
    Aig_ManStop( pTemp );
    Vec_PtrFree( vPios );

    // reset levels
    pMan->pManTime = pManTime;
    Aig_ManChoiceLevel( pMan );

    // copy names
    ABC_FREE( pMan->pName );
    ABC_FREE( pMan->pSpec );
    pMan->pName = pName;
    pMan->pSpec = pSpec;
    return pMan;
}